

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O3

Own<kj::_::ExclusiveJoinPromiseNode,_kj::_::PromiseDisposer> __thiscall
kj::_::PromiseDisposer::
alloc<kj::_::ExclusiveJoinPromiseNode,kj::_::PromiseDisposer,kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>,kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>,kj::SourceLocation&>
          (PromiseDisposer *this,Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *params,
          Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *params_1,SourceLocation *params_2)

{
  OwnPromiseNode OVar1;
  void *pvVar2;
  OwnPromiseNode local_40;
  OwnPromiseNode local_38;
  
  pvVar2 = operator_new(0x400);
  local_38.ptr = params->ptr;
  params->ptr = (PromiseNode *)0x0;
  local_40.ptr = params_1->ptr;
  params_1->ptr = (PromiseNode *)0x0;
  ExclusiveJoinPromiseNode::ExclusiveJoinPromiseNode
            ((ExclusiveJoinPromiseNode *)((long)pvVar2 + 0x348),&local_38,&local_40,*params_2);
  OVar1.ptr = local_40.ptr;
  if (&(local_40.ptr)->super_PromiseArenaMember != (PromiseArenaMember *)0x0) {
    local_40.ptr = (PromiseNode *)0x0;
    dispose(&(OVar1.ptr)->super_PromiseArenaMember);
  }
  OVar1.ptr = local_38.ptr;
  if (&(local_38.ptr)->super_PromiseArenaMember != (PromiseArenaMember *)0x0) {
    local_38.ptr = (PromiseNode *)0x0;
    dispose(&(OVar1.ptr)->super_PromiseArenaMember);
  }
  *(void **)((long)pvVar2 + 0x350) = pvVar2;
  *(ExclusiveJoinPromiseNode **)this = (ExclusiveJoinPromiseNode *)((long)pvVar2 + 0x348);
  return (Own<kj::_::ExclusiveJoinPromiseNode,_kj::_::PromiseDisposer>)
         (ExclusiveJoinPromiseNode *)this;
}

Assistant:

static kj::Own<T, D> alloc(Params&&... params) noexcept {
    // Implements allocPromise().
    T* ptr;
    if (!canArenaAllocate<T>()) {
      // Node too big (or needs weird alignment), fall back to regular heap allocation.
      ptr = new T(kj::fwd<Params>(params)...);
    } else {
      // Start a new arena.
      //
      // NOTE: As in appendPromise() (below), we don't implement exception-safety because it causes
      //   code bloat and these constructors probably don't throw. Instead this function is
      //   noexcept, so if a constructor does throw, it'll crash rather than leak memory.
      auto* arena = new PromiseArena;
      ptr = reinterpret_cast<T*>(arena + 1) - 1;
      ctor(*ptr, kj::fwd<Params>(params)...);
      ptr->arena = arena;
      KJ_IREQUIRE(reinterpret_cast<void*>(ptr) ==
                  reinterpret_cast<void*>(static_cast<PromiseArenaMember*>(ptr)),
          "PromiseArenaMember must be the leftmost inherited type.");
    }
    return kj::Own<T, D>(ptr);
  }